

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  int *piVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  long in_R8;
  Mat AT_tile;
  int max_kk;
  int max_ii;
  int k;
  Mat A_tile;
  int i;
  int ppj;
  Mat A_tileX;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int B;
  int K;
  int M;
  Mat *m_1;
  Mat *m;
  undefined8 uVar2;
  int max_ii_00;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  Mat *in_stack_fffffffffffffb78;
  Mat *in_stack_fffffffffffffb80;
  void **ppvVar3;
  int in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  Mat *in_stack_fffffffffffffb90;
  Mat *pMVar4;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  int max_kk_00;
  Mat *in_stack_fffffffffffffba0;
  int *in_stack_fffffffffffffbc0;
  int *in_stack_fffffffffffffbc8;
  int *in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e8;
  Allocator *local_3e0;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined8 local_3c0;
  Mat local_3b8;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  Mat local_358;
  int local_30c;
  int local_308;
  void *local_2f8;
  int *local_2f0;
  ulong local_2e8;
  int local_2e0;
  Allocator *local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  undefined4 local_2c0;
  long local_2b8;
  int local_2ac;
  int local_2a8 [2];
  int local_2a0 [3];
  int local_294;
  long local_290;
  long *local_280;
  undefined8 *local_270;
  Mat *local_260;
  Mat *local_250;
  void **local_240;
  int local_220;
  undefined4 local_21c;
  void **local_218;
  int local_200;
  undefined4 local_1fc;
  Mat *local_1f8;
  int local_1e0;
  undefined4 local_1dc;
  Mat *local_1d8;
  undefined8 *local_1b8;
  undefined1 local_1ad;
  int local_1ac;
  undefined8 *local_1a0;
  undefined1 local_17d;
  int local_17c;
  void **local_178;
  Mat *local_170;
  void *local_130;
  void *local_120;
  void *local_110;
  undefined8 local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined4 local_e8;
  int local_e4;
  void **local_e0;
  int local_d4;
  undefined8 *local_d0;
  Mat *local_c8;
  Allocator *local_c0;
  int local_b4;
  size_t local_b0;
  void *local_a8;
  int local_a0;
  int local_9c;
  Mat *local_98;
  Allocator *local_90;
  int local_84;
  ulong local_80;
  void *local_78;
  int local_6c;
  int local_68;
  int local_64;
  Mat *local_60;
  Allocator *local_58;
  int local_4c;
  size_t local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_2a0[1] = 0x10;
  local_2a0[2] = in_EDX;
  local_294 = in_ECX;
  local_290 = in_R8;
  local_280 = in_RSI;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(int)in_stack_fffffffffffffbe0,
             (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbf0);
  local_2ac = (local_294 + -1 + local_2a0[0]) / local_2a0[0];
  local_e4 = local_2a0[0] * local_2a8[0] * 0x10;
  local_ec = *(undefined4 *)(local_290 + 4);
  local_e0 = &local_2f8;
  local_e8 = 1;
  local_f8 = 4;
  local_100 = 0;
  local_2f8 = (void *)0x0;
  local_2f0 = (int *)0x0;
  local_2e8 = 0;
  local_2e0 = 0;
  local_2d8 = (Allocator *)0x0;
  local_2d0 = 0;
  local_2cc = 0;
  local_2c8 = 0;
  local_2c4 = 0;
  local_2c0 = 0;
  local_2b8 = 0;
  Mat::create(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98,
              (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),
              CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
              (Allocator *)in_stack_fffffffffffffb80);
  uVar2 = 0;
  Mat::create(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
              (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),(int)in_stack_fffffffffffffb80,
              (size_t)in_stack_fffffffffffffb78,
              (Allocator *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  for (local_308 = 0; local_308 < local_2ac; local_308 = local_308 + 1) {
    local_30c = local_308 * local_2a0[0];
    local_17c = get_omp_thread_num();
    local_170 = &local_358;
    local_178 = &local_2f8;
    local_78 = (void *)((long)local_2f8 + local_2b8 * local_17c * local_2e8);
    local_60 = &local_358;
    local_358.refcount = (int *)0x0;
    local_358.elemsize = local_2e8;
    local_358.elempack = local_2e0;
    local_358.allocator = local_2d8;
    local_358.w = local_2cc;
    local_358.h = local_2c8;
    local_358.d = 1;
    local_358.c = local_2c4;
    local_8 = (long)local_2cc * (long)local_2c8 * local_2e8;
    local_358.cstep = (local_8 + 0xfU & 0xfffffffffffffff0) / local_2e8;
    local_358.dims = local_2d0 + -1;
    if (local_2d0 == 4) {
      local_358.cstep = (long)local_2cc * (long)local_2c8;
    }
    local_c = 0x10;
    local_64 = local_2cc;
    local_68 = local_2c8;
    local_6c = local_2c4;
    local_80 = local_2e8;
    local_84 = local_2e0;
    local_90 = local_2d8;
    local_17d = 1;
    local_35c = 0;
    local_358.data = local_78;
    while( true ) {
      max_kk_00 = (int)in_stack_fffffffffffffba0;
      max_ii_00 = (int)((ulong)uVar2 >> 0x20);
      if (local_2a0[2] <= local_35c) break;
      local_364 = local_294 - local_30c;
      piVar1 = std::min<int>(&local_364,local_2a0);
      local_360 = *piVar1;
      local_36c = local_2a0[2] - local_35c;
      piVar1 = std::min<int>(&local_36c,local_2a8);
      local_368 = *piVar1;
      uVar2 = CONCAT44(max_ii_00,local_368);
      conv3x3s1_winograd23_transform_kernel_tile
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                 in_stack_fffffffffffffb70,max_ii_00,local_368,max_kk_00);
      local_1ac = local_30c / local_2a0[0];
      local_1a0 = &local_400;
      local_9c = *(int *)((long)local_280 + 0x2c);
      local_a0 = (int)local_280[6];
      local_34 = *(undefined4 *)((long)local_280 + 0x34);
      local_40 = *local_280 + local_280[8] * (long)local_1ac * local_280[2];
      local_b0 = local_280[2];
      local_b4 = (int)local_280[3];
      local_c0 = (Allocator *)local_280[4];
      local_28 = &local_400;
      local_18 = (long)local_9c * (long)local_a0 * local_b0;
      local_d4 = local_35c / local_2a8[0];
      local_c8 = &local_3b8;
      local_d0 = &local_400;
      local_a8 = (void *)(local_40 + (long)local_9c * (long)local_a0 * (long)local_d4 * local_b0);
      local_98 = &local_3b8;
      local_3b8.cstep = (long)local_9c * (long)local_a0;
      local_270 = &local_400;
      local_3b8.c = 1;
      local_3b8.d = 1;
      local_3b8.dims = 2;
      local_3b8.refcount = (int *)0x0;
      local_1c = 0x10;
      local_1ad = 1;
      local_400 = 0;
      local_3f0 = 0;
      local_3e8 = 0;
      local_3d8 = 0;
      local_3d4 = 0;
      local_3d0 = 0;
      local_3cc = 0;
      local_3c8 = 0;
      local_3c0 = 0;
      local_3f8 = 0;
      local_1b8 = local_270;
      local_58 = local_c0;
      local_4c = local_b4;
      local_48 = local_b0;
      local_30 = local_a0;
      local_2c = local_9c;
      local_3e0 = local_c0;
      local_3b8.data = local_a8;
      local_3b8.elemsize = local_b0;
      local_3b8.elempack = local_b4;
      local_3b8.allocator = local_c0;
      local_3b8.w = local_9c;
      local_3b8.h = local_a0;
      pack_A_tile(&local_358,&local_3b8,0x10,local_360,local_368);
      in_stack_fffffffffffffba0 = &local_3b8;
      local_260 = in_stack_fffffffffffffba0;
      local_1d8 = in_stack_fffffffffffffba0;
      if (local_3b8.refcount != (int *)0x0) {
        local_1dc = 0xffffffff;
        LOCK();
        local_1e0 = *local_3b8.refcount;
        *local_3b8.refcount = *local_3b8.refcount + -1;
        UNLOCK();
        if (local_1e0 == 1) {
          if (local_3b8.allocator == (Allocator *)0x0) {
            local_130 = local_3b8.data;
            if (local_3b8.data != (void *)0x0) {
              free(local_3b8.data);
            }
          }
          else {
            (*(local_3b8.allocator)->_vptr_Allocator[3])(local_3b8.allocator,local_3b8.data);
          }
        }
      }
      in_stack_fffffffffffffba0->data = (void *)0x0;
      in_stack_fffffffffffffba0->elemsize = 0;
      in_stack_fffffffffffffba0->elempack = 0;
      in_stack_fffffffffffffba0->dims = 0;
      in_stack_fffffffffffffba0->w = 0;
      in_stack_fffffffffffffba0->h = 0;
      in_stack_fffffffffffffba0->d = 0;
      in_stack_fffffffffffffba0->c = 0;
      in_stack_fffffffffffffba0->cstep = 0;
      in_stack_fffffffffffffba0->refcount = (int *)0x0;
      local_35c = local_2a8[0] + local_35c;
    }
    pMVar4 = &local_358;
    local_250 = pMVar4;
    local_1f8 = pMVar4;
    if (local_358.refcount != (int *)0x0) {
      local_1fc = 0xffffffff;
      LOCK();
      local_200 = *local_358.refcount;
      *local_358.refcount = *local_358.refcount + -1;
      UNLOCK();
      if (local_200 == 1) {
        if (local_358.allocator == (Allocator *)0x0) {
          local_120 = local_358.data;
          if (local_358.data != (void *)0x0) {
            free(local_358.data);
          }
        }
        else {
          (*(local_358.allocator)->_vptr_Allocator[3])(local_358.allocator,local_358.data);
        }
      }
    }
    pMVar4->data = (void *)0x0;
    pMVar4->elemsize = 0;
    pMVar4->elempack = 0;
    pMVar4->dims = 0;
    pMVar4->w = 0;
    pMVar4->h = 0;
    pMVar4->d = 0;
    pMVar4->c = 0;
    pMVar4->cstep = 0;
    pMVar4->refcount = (int *)0x0;
  }
  ppvVar3 = &local_2f8;
  if (local_2f0 != (int *)0x0) {
    local_21c = 0xffffffff;
    LOCK();
    local_220 = *local_2f0;
    *local_2f0 = *local_2f0 + -1;
    UNLOCK();
    if (local_220 == 1) {
      local_240 = ppvVar3;
      local_218 = ppvVar3;
      if (local_2d8 == (Allocator *)0x0) {
        local_110 = local_2f8;
        if (local_2f8 != (void *)0x0) {
          free(local_2f8);
        }
      }
      else {
        (*local_2d8->_vptr_Allocator[3])(local_2d8,local_2f8);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 16;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd23_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}